

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O1

optional<long> __thiscall b_tree_node::_search(b_tree_node *this,int64_t k)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  _Storage<long,_true> unaff_R14;
  optional<long> oVar4;
  b_tree_node child;
  b_tree_node bStack_78;
  
  uVar1 = *this->_num_keys_field;
  uVar2 = (uint)uVar1;
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (k <= this->_keys_field[uVar3]) {
        uVar2 = (uint)uVar3;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (this->_keys_field[uVar2] == k) {
    if (this->_valid_keys_field[uVar2] == '\x01') {
      unaff_R14 = (_Storage<long,_true>)
                  ((_Storage<long,_true> *)(this->_vals_field + uVar2))->_M_value;
      uVar3 = CONCAT71((int7)((ulong)k >> 8),1);
      goto LAB_00108ebc;
    }
  }
  else if (*this->_leaf_field == 0) {
    b_tree_node(&bStack_78,this->_p,this->_child_ofs_field[(ushort)uVar2]);
    oVar4 = _search(&bStack_78,k);
    unaff_R14._M_value =
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    uVar3 = (ulong)oVar4.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._8_4_;
    r_memory_map::~r_memory_map(&bStack_78._mm);
    goto LAB_00108ebc;
  }
  uVar3 = 0;
LAB_00108ebc:
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar3 & 0xffffffff;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = unaff_R14._M_value;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

optional<int64_t> b_tree_node::_search(int64_t k)
{
    // Find the first key greater than or equal to k
    int i = 0;
    while (i < _num_keys() && k > _keys_field[i])
        i++;
 
    optional<int64_t> result;
    // If the found key is equal to k, return this node
    if (_keys_field[i] == k)
    {
        if(_valid_keys_field[i] == 1)
            result = _vals_field[i];
        return result;
    }
 
    // If key is not found here and this is a leaf node
    if (_leaf() == true)
        return result;
 
    // Go to the appropriate child
    b_tree_node child(_p, _child_ofs(i));
    return child._search(k);
}